

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O3

void __thiscall
tchecker::
intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
::reset(intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
        *this,make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>
              *t)

{
  make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>
  *pmVar1;
  long lVar2;
  underflow_error *this_00;
  code *pcVar3;
  undefined *puVar4;
  
  if ((t != (make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>
             *)0x0) &&
     (lVar2 = *(long *)&t[-1].
                        super_edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>
                        ._edge_type + 1,
     *(long *)&t[-1].
               super_edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>
               ._edge_type = lVar2, lVar2 == -2)) {
    this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error((overflow_error *)this_00,"reference counter overflow");
    puVar4 = &std::overflow_error::typeinfo;
    pcVar3 = std::overflow_error::~overflow_error;
LAB_001228d3:
    __cxa_throw(this_00,puVar4,pcVar3);
  }
  pmVar1 = this->_t;
  if (pmVar1 != (make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>
                 *)0x0) {
    lVar2 = *(long *)&pmVar1[-1].
                      super_edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>
                      ._edge_type;
    if (lVar2 == 0) {
      this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
      std::underflow_error::underflow_error(this_00,"reference counter underflow");
      puVar4 = &std::underflow_error::typeinfo;
      pcVar3 = std::underflow_error::~underflow_error;
      goto LAB_001228d3;
    }
    *(long *)&pmVar1[-1].
              super_edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>
              ._edge_type = lVar2 + -1;
  }
  this->_t = t;
  return;
}

Assistant:

inline void reset(T * t = nullptr)
  {
    if (t != nullptr)
      t->take_reference();
    if (_t != nullptr)
      _t->release_reference();
    _t = t;
  }